

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::MessageGenerator
          (MessageGenerator *this,Descriptor *descriptor,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *vars,int index_in_file_messages,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  int iVar1;
  StringPiece injector_template_suffix;
  StringPiece injector_template_suffix_00;
  StringPiece injector_template_suffix_01;
  StringPiece injector_template_suffix_02;
  StringPiece injector_template_suffix_03;
  MessageSCCAnalyzer *pMVar2;
  bool bVar3;
  FileOptions_OptimizeMode FVar4;
  int iVar5;
  pointer pMVar6;
  mapped_type *pmVar7;
  string *psVar8;
  FileDescriptor *this_00;
  FileOptions *this_01;
  OneofDescriptor *pOVar9;
  reference ppFVar10;
  char *pcVar11;
  reference pvVar12;
  FieldDescriptor *pFVar13;
  ParseFunctionGenerator *this_02;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  *__rhs;
  Options *pOVar14;
  Iterator IVar15;
  int local_364;
  int i;
  FieldDescriptor *field_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3_1;
  value_type field;
  Iterator __end3;
  Iterator __begin3;
  FieldRangeImpl<google::protobuf::Descriptor> *__range3;
  size_type sStack_300;
  StringPiece local_2f8;
  StringPiece local_2e8;
  StringPiece local_2d8;
  StringPiece local_2c8;
  StringPiece local_2b8;
  StringPiece local_2a8;
  StringPiece local_298;
  StringPiece local_288;
  StringPiece local_278;
  StringPiece local_268;
  StringPiece local_258;
  StringPiece local_248;
  StringPiece local_238;
  StringPiece local_228;
  allocator local_211;
  undefined1 local_210 [8];
  string injector_template;
  key_type local_1e8;
  allocator local_1c1;
  key_type local_1c0;
  allocator local_199;
  key_type local_198;
  allocator local_171;
  key_type local_170;
  allocator local_149;
  key_type local_148;
  allocator local_121;
  key_type local_120;
  string local_100;
  allocator local_d9;
  key_type local_d8;
  allocator local_b1;
  key_type local_b0;
  string local_90;
  allocator local_69;
  key_type local_68;
  MessageSCCAnalyzer *local_38;
  MessageSCCAnalyzer *scc_analyzer_local;
  Options *options_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmStack_20;
  int index_in_file_messages_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars_local;
  Descriptor *descriptor_local;
  MessageGenerator *this_local;
  
  this->descriptor_ = descriptor;
  this->index_in_file_messages_ = index_in_file_messages;
  local_38 = scc_analyzer;
  scc_analyzer_local = (MessageSCCAnalyzer *)options;
  options_local._4_4_ = index_in_file_messages;
  pmStack_20 = vars;
  vars_local = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)descriptor;
  descriptor_local = (Descriptor *)this;
  ClassName_abi_cxx11_
            (&this->classname_,(cpp *)descriptor,(Descriptor *)0x0,SUB41(index_in_file_messages,0));
  Options::Options(&this->options_,(Options *)scc_analyzer_local);
  FieldGeneratorMap::FieldGeneratorMap
            (&this->field_generators_,(Descriptor *)vars_local,(Options *)scc_analyzer_local,
             local_38);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(&this->optimized_order_);
  std::vector<int,_std::allocator<int>_>::vector(&this->has_bit_indices_);
  this->max_has_bit_index_ = 0;
  std::vector<int,_std::allocator<int>_>::vector(&this->inlined_string_indices_);
  this->max_inlined_string_index_ = 0;
  std::
  vector<const_google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ::vector(&this->enum_generators_);
  std::
  vector<const_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ::vector(&this->extension_generators_);
  this->num_weak_fields_ = 0;
  std::
  unique_ptr<google::protobuf::compiler::cpp::MessageLayoutHelper,std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>>
  ::unique_ptr<std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>,void>
            ((unique_ptr<google::protobuf::compiler::cpp::MessageLayoutHelper,std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>>
              *)&this->message_layout_helper_);
  std::
  unique_ptr<google::protobuf::compiler::cpp::ParseFunctionGenerator,std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>>
  ::unique_ptr<std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>,void>
            ((unique_ptr<google::protobuf::compiler::cpp::ParseFunctionGenerator,std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>>
              *)&this->parse_function_generator_);
  this->scc_analyzer_ = local_38;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->variables_,pmStack_20);
  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->message_layout_helper_);
  if (!bVar3) {
    pMVar6 = (pointer)operator_new(8);
    PaddingOptimizer::PaddingOptimizer((PaddingOptimizer *)pMVar6);
    std::
    unique_ptr<google::protobuf::compiler::cpp::MessageLayoutHelper,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
    ::reset(&this->message_layout_helper_,pMVar6);
  }
  pOVar14 = (Options *)&this->classname_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"classname",&local_69);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_68);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&this->classname_);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  QualifiedClassName_abi_cxx11_
            (&local_90,(cpp *)this->descriptor_,(Descriptor *)scc_analyzer_local,pOVar14);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"classtype",&local_b1);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_b0);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string((string *)&local_90);
  psVar8 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"full_name",&local_d9);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_d8);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)psVar8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  SuperClassName_abi_cxx11_
            (&local_100,(cpp *)this->descriptor_,(Descriptor *)&this->options_,pOVar14);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"superclass",&local_121);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_120);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"annotate_serialize",&local_149);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_148);
  std::__cxx11::string::operator=((string *)pmVar7,"");
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"annotate_deserialize",&local_171);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_170);
  std::__cxx11::string::operator=((string *)pmVar7,"");
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"annotate_reflection",&local_199);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_198);
  std::__cxx11::string::operator=((string *)pmVar7,"");
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"annotate_bytesize",&local_1c1);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_1c0);
  std::__cxx11::string::operator=((string *)pmVar7,"");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1e8,"annotate_mergefrom",
             (allocator *)(injector_template.field_2._M_local_buf + 0xf));
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_1e8);
  std::__cxx11::string::operator=((string *)pmVar7,"");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)(injector_template.field_2._M_local_buf + 0xf));
  if (((scc_analyzer_local->options_).runtime_include_base.field_2._M_local_buf[0] & 1U) != 0) {
    this_00 = Descriptor::file((Descriptor *)vars_local);
    this_01 = FileDescriptor::options(this_00);
    FVar4 = FileOptions::optimize_for(this_01);
    if (FVar4 != FileOptions_OptimizeMode_LITE_RUNTIME) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_210,"  _tracker_.",&local_211);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      pMVar2 = scc_analyzer_local;
      stringpiece_internal::StringPiece::StringPiece(&local_228,"serialize");
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                (&local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210);
      stringpiece_internal::StringPiece::StringPiece(&local_248,"OnSerialize(this);\n");
      injector_template_suffix.length_ = local_248.length_;
      injector_template_suffix.ptr_ = local_248.ptr_;
      anon_unknown_0::MaySetAnnotationVariable
                ((Options *)pMVar2,local_228,local_238,injector_template_suffix,&this->variables_);
      pMVar2 = scc_analyzer_local;
      stringpiece_internal::StringPiece::StringPiece(&local_258,"deserialize");
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                (&local_268,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210);
      stringpiece_internal::StringPiece::StringPiece(&local_278,"OnDeserialize(this);\n");
      injector_template_suffix_00.length_ = local_278.length_;
      injector_template_suffix_00.ptr_ = local_278.ptr_;
      anon_unknown_0::MaySetAnnotationVariable
                ((Options *)pMVar2,local_258,local_268,injector_template_suffix_00,&this->variables_
                );
      pMVar2 = scc_analyzer_local;
      stringpiece_internal::StringPiece::StringPiece(&local_288,"reflection");
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                (&local_298,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210);
      stringpiece_internal::StringPiece::StringPiece(&local_2a8,"OnGetMetadata();\n");
      injector_template_suffix_01.length_ = local_2a8.length_;
      injector_template_suffix_01.ptr_ = local_2a8.ptr_;
      anon_unknown_0::MaySetAnnotationVariable
                ((Options *)pMVar2,local_288,local_298,injector_template_suffix_01,&this->variables_
                );
      pMVar2 = scc_analyzer_local;
      stringpiece_internal::StringPiece::StringPiece(&local_2b8,"bytesize");
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                (&local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210);
      stringpiece_internal::StringPiece::StringPiece(&local_2d8,"OnByteSize(this);\n");
      injector_template_suffix_02.length_ = local_2d8.length_;
      injector_template_suffix_02.ptr_ = local_2d8.ptr_;
      anon_unknown_0::MaySetAnnotationVariable
                ((Options *)pMVar2,local_2b8,local_2c8,injector_template_suffix_02,&this->variables_
                );
      pMVar2 = scc_analyzer_local;
      stringpiece_internal::StringPiece::StringPiece(&local_2e8,"mergefrom");
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                (&local_2f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210);
      stringpiece_internal::StringPiece::StringPiece
                ((StringPiece *)&__range3,"OnMergeFrom(this, &from);\n");
      injector_template_suffix_03.length_ = sStack_300;
      injector_template_suffix_03.ptr_ = (char *)__range3;
      anon_unknown_0::MaySetAnnotationVariable
                ((Options *)pMVar2,local_2e8,local_2f8,injector_template_suffix_03,&this->variables_
                );
      std::__cxx11::string::~string((string *)local_210);
    }
  }
  anon_unknown_0::GenerateExtensionAnnotations(this->descriptor_,&this->options_,&this->variables_);
  SetUnknownFieldsVariable(this->descriptor_,&this->options_,&this->variables_);
  __begin3.descriptor = (Descriptor *)FieldRange<google::protobuf::Descriptor>(this->descriptor_);
  IVar15 = FieldRangeImpl<google::protobuf::Descriptor>::begin
                     ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
  __begin3._0_8_ = IVar15.descriptor;
  __end3.descriptor._0_4_ = IVar15.idx;
  IVar15 = FieldRangeImpl<google::protobuf::Descriptor>::end
                     ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
  __end3._0_8_ = IVar15.descriptor;
  field._0_4_ = IVar15.idx;
  while (bVar3 = cpp::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&field), bVar3) {
    __range3_1 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                              ((Iterator *)&__end3.descriptor);
    bVar3 = IsFieldStripped((FieldDescriptor *)__range3_1,&this->options_);
    if (!bVar3) {
      bVar3 = IsWeak((FieldDescriptor *)__range3_1,&this->options_);
      if (bVar3) {
        this->num_weak_fields_ = this->num_weak_fields_ + 1;
      }
      else {
        pOVar9 = FieldDescriptor::real_containing_oneof((FieldDescriptor *)__range3_1);
        if (pOVar9 == (OneofDescriptor *)0x0) {
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::push_back(&this->optimized_order_,(value_type *)&__range3_1);
        }
      }
    }
    FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator++
              ((Iterator *)&__end3.descriptor);
  }
  pMVar6 = std::
           unique_ptr<google::protobuf::compiler::cpp::MessageLayoutHelper,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
           ::operator->(&this->message_layout_helper_);
  (*pMVar6->_vptr_MessageLayoutHelper[2])
            (pMVar6,&this->optimized_order_,&this->options_,this->scc_analyzer_);
  __end3_1 = std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::begin(&this->optimized_order_);
  field_1 = (FieldDescriptor *)
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::end(&this->optimized_order_);
  while( true ) {
    __rhs = (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
             *)&field_1;
    bVar3 = __gnu_cxx::operator!=(&__end3_1,__rhs);
    if (!bVar3) break;
    ppFVar10 = __gnu_cxx::
               __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
               ::operator*(&__end3_1);
    pFVar13 = *ppFVar10;
    bVar3 = HasHasbit(pFVar13);
    if (bVar3) {
      bVar3 = std::vector<int,_std::allocator<int>_>::empty(&this->has_bit_indices_);
      iVar5 = extraout_EDX;
      if (bVar3) {
        iVar5 = Descriptor::field_count(this->descriptor_);
        __rhs = (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                 *)(long)iVar5;
        std::vector<int,_std::allocator<int>_>::resize
                  (&this->has_bit_indices_,(size_type)__rhs,&(anonymous_namespace)::kNoHasbit);
        iVar5 = extraout_EDX_00;
      }
      iVar1 = this->max_has_bit_index_;
      this->max_has_bit_index_ = iVar1 + 1;
      pcVar11 = FieldDescriptor::index(pFVar13,(char *)__rhs,iVar5);
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&this->has_bit_indices_,(long)(int)pcVar11);
      *pvVar12 = iVar1;
    }
    pOVar14 = &this->options_;
    bVar3 = IsStringInlined(pFVar13,pOVar14);
    if (bVar3) {
      bVar3 = std::vector<int,_std::allocator<int>_>::empty(&this->inlined_string_indices_);
      iVar5 = extraout_EDX_01;
      if (bVar3) {
        iVar5 = Descriptor::field_count(this->descriptor_);
        pOVar14 = (Options *)(long)iVar5;
        std::vector<int,_std::allocator<int>_>::resize
                  (&this->inlined_string_indices_,(size_type)pOVar14,
                   &(anonymous_namespace)::kNoHasbit);
        iVar5 = extraout_EDX_02;
      }
      iVar1 = this->max_inlined_string_index_;
      this->max_inlined_string_index_ = iVar1 + 1;
      pcVar11 = FieldDescriptor::index(pFVar13,(char *)pOVar14,iVar5);
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&this->inlined_string_indices_,(long)(int)pcVar11);
      *pvVar12 = iVar1;
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end3_1);
  }
  bVar3 = std::vector<int,_std::allocator<int>_>::empty(&this->has_bit_indices_);
  if (!bVar3) {
    FieldGeneratorMap::SetHasBitIndices(&this->field_generators_,&this->has_bit_indices_);
  }
  bVar3 = std::vector<int,_std::allocator<int>_>::empty(&this->inlined_string_indices_);
  if (!bVar3) {
    FieldGeneratorMap::SetInlinedStringIndices
              (&this->field_generators_,&this->inlined_string_indices_);
  }
  this->num_required_fields_ = 0;
  for (local_364 = 0; iVar5 = Descriptor::field_count((Descriptor *)vars_local), local_364 < iVar5;
      local_364 = local_364 + 1) {
    pFVar13 = Descriptor::field((Descriptor *)vars_local,local_364);
    bVar3 = FieldDescriptor::is_required(pFVar13);
    if (bVar3) {
      this->num_required_fields_ = this->num_required_fields_ + 1;
    }
  }
  bVar3 = anon_unknown_0::TableDrivenParsingEnabled
                    (this->descriptor_,&this->options_,this->scc_analyzer_);
  this->table_driven_ = bVar3;
  this_02 = (ParseFunctionGenerator *)operator_new(0x70);
  ParseFunctionGenerator::ParseFunctionGenerator
            (this_02,this->descriptor_,this->max_has_bit_index_,&this->has_bit_indices_,
             &this->inlined_string_indices_,&this->options_,this->scc_analyzer_,&this->variables_);
  std::
  unique_ptr<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
  ::reset(&this->parse_function_generator_,this_02);
  return;
}

Assistant:

MessageGenerator::MessageGenerator(
    const Descriptor* descriptor,
    const std::map<std::string, std::string>& vars, int index_in_file_messages,
    const Options& options, MessageSCCAnalyzer* scc_analyzer)
    : descriptor_(descriptor),
      index_in_file_messages_(index_in_file_messages),
      classname_(ClassName(descriptor, false)),
      options_(options),
      field_generators_(descriptor, options, scc_analyzer),
      max_has_bit_index_(0),
      max_inlined_string_index_(0),
      num_weak_fields_(0),
      scc_analyzer_(scc_analyzer),
      variables_(vars) {
  if (!message_layout_helper_) {
    message_layout_helper_.reset(new PaddingOptimizer());
  }

  // Variables that apply to this class
  variables_["classname"] = classname_;
  variables_["classtype"] = QualifiedClassName(descriptor_, options);
  variables_["full_name"] = descriptor_->full_name();
  variables_["superclass"] = SuperClassName(descriptor_, options_);
  variables_["annotate_serialize"] = "";
  variables_["annotate_deserialize"] = "";
  variables_["annotate_reflection"] = "";
  variables_["annotate_bytesize"] = "";
  variables_["annotate_mergefrom"] = "";

  if (options.field_listener_options.inject_field_listener_events &&
      descriptor->file()->options().optimize_for() !=
          google::protobuf::FileOptions::LITE_RUNTIME) {
    const std::string injector_template = "  _tracker_.";

    MaySetAnnotationVariable(options, "serialize", injector_template,
                             "OnSerialize(this);\n", &variables_);
    MaySetAnnotationVariable(options, "deserialize", injector_template,
                             "OnDeserialize(this);\n", &variables_);
    // TODO(danilak): Ideally annotate_reflection should not exist and we need
    // to annotate all reflective calls on our own, however, as this is a cause
    // for side effects, i.e. reading values dynamically, we want the users know
    // that dynamic access can happen.
    MaySetAnnotationVariable(options, "reflection", injector_template,
                             "OnGetMetadata();\n", &variables_);
    MaySetAnnotationVariable(options, "bytesize", injector_template,
                             "OnByteSize(this);\n", &variables_);
    MaySetAnnotationVariable(options, "mergefrom", injector_template,
                             "OnMergeFrom(this, &from);\n", &variables_);
  }

  GenerateExtensionAnnotations(descriptor_, options_, &variables_);

  SetUnknownFieldsVariable(descriptor_, options_, &variables_);

  // Compute optimized field order to be used for layout and initialization
  // purposes.
  for (auto field : FieldRange(descriptor_)) {
    if (IsFieldStripped(field, options_)) {
      continue;
    }

    if (IsWeak(field, options_)) {
      num_weak_fields_++;
    } else if (!field->real_containing_oneof()) {
      optimized_order_.push_back(field);
    }
  }

  message_layout_helper_->OptimizeLayout(&optimized_order_, options_,
                                         scc_analyzer_);

  // This message has hasbits iff one or more fields need one.
  for (auto field : optimized_order_) {
    if (HasHasbit(field)) {
      if (has_bit_indices_.empty()) {
        has_bit_indices_.resize(descriptor_->field_count(), kNoHasbit);
      }
      has_bit_indices_[field->index()] = max_has_bit_index_++;
    }
    if (IsStringInlined(field, options_)) {
      if (inlined_string_indices_.empty()) {
        inlined_string_indices_.resize(descriptor_->field_count(), kNoHasbit);
      }
      inlined_string_indices_[field->index()] = max_inlined_string_index_++;
    }
  }

  if (!has_bit_indices_.empty()) {
    field_generators_.SetHasBitIndices(has_bit_indices_);
  }

  if (!inlined_string_indices_.empty()) {
    field_generators_.SetInlinedStringIndices(inlined_string_indices_);
  }

  num_required_fields_ = 0;
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (descriptor->field(i)->is_required()) {
      ++num_required_fields_;
    }
  }

  table_driven_ =
      TableDrivenParsingEnabled(descriptor_, options_, scc_analyzer_);
  parse_function_generator_.reset(new ParseFunctionGenerator(
      descriptor_, max_has_bit_index_, has_bit_indices_,
      inlined_string_indices_, options_, scc_analyzer_, variables_));
}